

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTypes.h
# Opt level: O0

bool glslang::isTypeUnsignedInt(TBasicType type)

{
  bool local_9;
  TBasicType type_local;
  
  if ((((type == EbtUint8) || (type == EbtUint16)) || (type == EbtUint)) || (type == EbtUint64)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

__inline bool isTypeUnsignedInt(TBasicType type)
{
    switch (type) {
    case EbtUint8:
    case EbtUint16:
    case EbtUint:
    case EbtUint64:
        return true;
    default:
        return false;
    }
}